

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_BnB_Node.h
# Opt level: O0

Index __thiscall BGIP_BnB_Node::GetSpecifiedAction(BGIP_BnB_Node *this,Index agI,Index depth_tI)

{
  bool bVar1;
  size_t sVar2;
  const_reference pvVar3;
  ostream *poVar4;
  undefined8 uVar5;
  uint in_EDX;
  uint in_ESI;
  shared_ptr<BGIP_BnB_Node> *in_RDI;
  stringstream ss;
  size_t d;
  stringstream *in_stack_fffffffffffffe18;
  E *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe48;
  E *in_stack_fffffffffffffe50;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  Index local_4;
  
  sVar2 = GetDepth((BGIP_BnB_Node *)in_RDI);
  if (in_EDX == sVar2) {
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&in_RDI[2].pn,
                        (ulong)in_ESI);
    local_4 = *pvVar3;
  }
  else {
    if (sVar2 <= in_EDX) {
      uVar5 = __cxa_allocate_exception(0x28);
      E::E(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      __cxa_throw(uVar5,&E::typeinfo,E::~E);
    }
    bVar1 = boost::operator==((shared_ptr<BGIP_BnB_Node> *)in_stack_fffffffffffffe20,
                              in_stack_fffffffffffffe18);
    if (bVar1) {
      std::__cxx11::stringstream::stringstream(local_1a8);
      poVar4 = std::operator<<(local_198,
                               "asking parent value, but this node (at depth/that specifies ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(uint *)&in_RDI[2].px);
      std::operator<<(poVar4," joint actions (for as many joint types) ) has no parent!");
      uVar5 = __cxa_allocate_exception(0x28);
      E::E(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      __cxa_throw(uVar5,&E::typeinfo,E::~E);
    }
    boost::shared_ptr<BGIP_BnB_Node>::operator->(in_RDI);
    local_4 = GetSpecifiedAction((BGIP_BnB_Node *)CONCAT44(in_ESI,in_EDX),(Index)(sVar2 >> 0x20),
                                 (Index)sVar2);
  }
  return local_4;
}

Assistant:

Index GetSpecifiedAction(Index agI, Index depth_tI) const
    { 
        size_t d = this->GetDepth();
        if( depth_tI == d )
            return _m_specifiedActions[agI];
        else if (depth_tI < d)
        {
            if(_m_parent == 0)
            {
                std::stringstream ss;
                ss << "asking parent value, but this node (at depth/that specifies "<<_m_depth<<" joint actions (for as many joint types) ) has no parent!";
                throw E(ss);
            }
            return _m_parent->GetSpecifiedAction(agI, depth_tI);
        }
        else
            throw E("Error asking node for action at a deeper level!");
    }